

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatclient.cpp
# Opt level: O3

void __thiscall ChatClient::login(ChatClient *this,QString *userName)

{
  int iVar1;
  QJsonObject message;
  QDataStream clientStream;
  undefined1 local_90 [8];
  QString local_88;
  QByteArray local_70;
  undefined1 local_58 [16];
  undefined8 local_48;
  QDataStream local_40 [24];
  undefined4 local_28;
  QJsonValueRef local_20 [16];
  
  iVar1 = QAbstractSocket::state();
  if (iVar1 == 3) {
    QDataStream::QDataStream(local_40,(QIODevice *)this->m_clientSocket);
    local_28 = 0x11;
    QJsonObject::QJsonObject((QJsonObject *)local_90);
    local_88.d.d = (Data *)0x0;
    local_88.d.ptr = L"login";
    local_88.d.size = 5;
    QJsonValue::QJsonValue((QJsonValue *)&local_70,&local_88);
    local_58._0_8_ = (QArrayData *)0x0;
    local_58._8_8_ = L"type";
    local_48 = 4;
    local_20 = (QJsonValueRef  [16])QJsonObject::operator[]((QString *)local_90);
    QJsonValueRef::operator=(local_20,(QJsonValue *)&local_70);
    if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58._0_8_,2,8);
      }
    }
    QJsonValue::~QJsonValue((QJsonValue *)&local_70);
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
      }
    }
    QJsonValue::QJsonValue((QJsonValue *)&local_70,userName);
    local_88.d.d = (Data *)0x0;
    local_88.d.ptr = L"username";
    local_88.d.size = 8;
    local_58 = QJsonObject::operator[]((QString *)local_90);
    QJsonValueRef::operator=((QJsonValueRef *)local_58,(QJsonValue *)&local_70);
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
      }
    }
    QJsonValue::~QJsonValue((QJsonValue *)&local_70);
    QJsonDocument::QJsonDocument((QJsonDocument *)&local_88,(QJsonObject *)local_90);
    QJsonDocument::toJson((JsonFormat)&local_70);
    operator<<(local_40,&local_70);
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,1,8);
      }
    }
    QJsonDocument::~QJsonDocument((QJsonDocument *)&local_88);
    QJsonObject::~QJsonObject((QJsonObject *)local_90);
    QDataStream::~QDataStream(local_40);
  }
  return;
}

Assistant:

void ChatClient::login(const QString &userName)
{
    if (m_clientSocket->state() == QAbstractSocket::ConnectedState) { // if the client is connected
        // create a QDataStream operating on the socket
        QDataStream clientStream(m_clientSocket);
        // set the version so that programs compiled with different versions of Qt can agree on how to serialise
        clientStream.setVersion(QDataStream::Qt_5_7);
        // Create the JSON we want to send
        QJsonObject message;
        message[QStringLiteral("type")] = QStringLiteral("login");
        message[QStringLiteral("username")] = userName;
        // send the JSON using QDataStream
        clientStream << QJsonDocument(message).toJson(QJsonDocument::Compact);
    }
}